

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_u_tau(REF_DBL y,REF_DBL u,REF_DBL nu_mach_re,REF_DBL *u_tau)

{
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  double dVar12;
  REF_DBL uplus_error;
  double local_98;
  double local_88;
  undefined8 uStack_80;
  REF_DBL dyplus_duplus;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double local_38;
  
  local_88 = u;
  if (u <= -u) {
    local_88 = -u;
  }
  local_98 = y;
  if (y <= -y) {
    local_98 = -y;
  }
  auVar8._0_8_ = local_98 * 1e+20;
  auVar8._8_8_ = local_88;
  auVar9._8_8_ = -local_88;
  auVar9._0_8_ = -auVar8._0_8_;
  auVar9 = maxpd(auVar8,auVar9);
  if (auVar9._0_8_ <= auVar9._8_8_) {
    *u_tau = nu_mach_re;
LAB_001bb045:
    RVar1 = 0;
  }
  else {
    dVar6 = (local_88 / local_98) * nu_mach_re;
    uStack_80 = in_XMM1_Qb;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (dVar6 <= local_88 / 30.0) {
      dVar6 = local_88 / 30.0;
    }
    *u_tau = dVar6;
    local_38 = local_98 / nu_mach_re;
    bVar5 = true;
    iVar3 = 100;
    do {
      if (!bVar5) goto LAB_001bb045;
      local_48 = (local_98 * dVar6) / nu_mach_re;
      uVar2 = ref_phys_spalding_uplus(local_48,&uplus_error);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x2da,"ref_phys_u_tau",(ulong)uVar2,"uplus");
        goto LAB_001bb256;
      }
      local_68 = local_88 / dVar6;
      uStack_60 = uStack_80;
      uplus_error = uplus_error - local_68;
      uStack_50 = 0;
      local_58 = uplus_error;
      ref_phys_spalding_dyplus_duplus(local_68,&dyplus_duplus);
      dVar6 = *u_tau - local_58 / (local_88 / (dVar6 * dVar6) + local_38 / dyplus_duplus);
      *u_tau = dVar6;
      auVar11._0_8_ = local_68 * 1e+20;
      auVar11._8_8_ = local_58;
      auVar10._0_8_ = -auVar11._0_8_;
      auVar10._8_8_ = -local_58;
      auVar9 = maxpd(auVar11,auVar10);
      dVar7 = auVar9._8_8_;
      if (auVar9._0_8_ <= dVar7) {
LAB_001bb1af:
        bVar5 = dVar7 == 1e-15;
        bVar4 = dVar7 < 1e-15;
      }
      else {
        dVar12 = local_68;
        if (local_68 <= -local_68) {
          dVar12 = -local_68;
        }
        if (dVar12 <= 0.001) goto LAB_001bb1af;
        dVar7 = local_58 / local_68;
        if (dVar7 <= -dVar7) {
          dVar7 = -dVar7;
        }
        bVar5 = dVar7 == 1e-12;
        bVar4 = dVar7 < 1e-12;
      }
      bVar5 = !bVar4 && !bVar5;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2ef,
           "ref_phys_u_tau","iteration count exceeded");
    printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n",local_98,local_88,local_48,local_68,
           local_58,*u_tau);
LAB_001bb256:
    RVar1 = 1;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_phys_u_tau(REF_DBL y, REF_DBL u, REF_DBL nu_mach_re,
                                  REF_DBL *u_tau) {
  REF_DBL uplus, yplus;
  REF_DBL uplus_error;
  REF_DBL dyplus_duplus;
  REF_DBL uplus_error_du_tau;
  REF_DBL duplus_du_tau, dyplus_du_tau;
  REF_DBL du_tau;
  REF_BOOL keep_going;
  REF_INT iters;
  REF_BOOL verbose = REF_FALSE;
  u = ABS(u); /* only admit positive values */
  y = ABS(y);
  if (!ref_math_divisible(u, y)) {
    *u_tau = nu_mach_re;
    if (verbose) {
      uplus = u / (*u_tau);
      yplus = y * (*u_tau) / nu_mach_re;
      uplus_error = 0.0;
      printf("u_tau %e yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    }
    return REF_SUCCESS;
  }
  *u_tau = sqrt(u / y * nu_mach_re); /* guess to start newton */
  uplus = 30;                        /* edge of boundary layer guess */
  (*u_tau) = MAX((*u_tau), (u / uplus));
  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    uplus = u / (*u_tau);
    duplus_du_tau = -u / ((*u_tau) * (*u_tau));
    yplus = y * (*u_tau) / nu_mach_re;
    dyplus_du_tau = y / nu_mach_re;
    RSS(ref_phys_spalding_uplus(yplus, &uplus_error), "uplus");
    uplus_error -= uplus;
    RSS(ref_phys_spalding_dyplus_duplus(uplus, &dyplus_duplus),
        "dyplus_duplus");
    uplus_error_du_tau = dyplus_du_tau / dyplus_duplus - duplus_du_tau;
    du_tau = -uplus_error / uplus_error_du_tau;
    if (verbose)
      printf("u_tau %f yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    (*u_tau) += du_tau;

    if (ref_math_divisible(uplus_error, uplus) && ABS(uplus) > 1.0e-3) {
      keep_going = (ABS(uplus_error / uplus) > 1.0e-12);
    } else {
      keep_going = (ABS(uplus_error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded", {
      printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n", y, u, yplus,
             uplus, uplus_error, *u_tau);
    });
  }
  return REF_SUCCESS;
}